

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
remove_thread(MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
             ThreadId thread_ref)

{
  _threads_iterator thread;
  
  thread = getThread(this,thread_ref);
  thread_remove_scheduling(this,thread);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
                      *)&this->threads,(iterator)thread._M_node);
  return;
}

Assistant:

void remove_thread(const ThreadId thread_ref) {
				auto thread = getThread(thread_ref);
				thread_remove_scheduling(thread);
				threads.erase(thread);
			}